

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_writer.c
# Opt level: O2

void nhdp_writer_send_hello(nhdp_interface *ninterf)

{
  rfc5444_result rVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  netaddr_str buf;
  
  if ((_cleanedup == '\0') && ((((ninterf->os_if_listener).data)->flags).loopback == false)) {
    if (((&log_global_mask)[LOG_NHDP_W] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP_W,"src/nhdp/nhdp/nhdp_writer.c",0xa4,0,0,
               "Sending Hello to interface %s",(ninterf->_node).key);
    }
    nhdp_domain_recalculate_mpr();
    _nhdp_if = ninterf;
    rVar1 = oonf_rfc5444_send_if(((ninterf->rfc5444_if).interface)->multicast4,'\0');
    if ((rVar1 < RFC5444_OKAY) && (uVar4 = (ulong)LOG_NHDP_W, ((&log_global_mask)[uVar4] & 4) != 0))
    {
      uVar2 = netaddr_to_prefixstring(&buf,&((ninterf->rfc5444_if).interface)->multicast4->dst,0);
      uVar3 = rfc5444_strerror(rVar1);
      oonf_log(4,uVar4,"src/nhdp/nhdp/nhdp_writer.c",0xaf,0,0,
               "Could not send NHDP message to %s: %s (%d)",uVar2,uVar3,rVar1);
    }
    rVar1 = oonf_rfc5444_send_if(((ninterf->rfc5444_if).interface)->multicast6,'\0');
    if ((rVar1 < RFC5444_OKAY) && (uVar4 = (ulong)LOG_NHDP_W, ((&log_global_mask)[uVar4] & 4) != 0))
    {
      uVar2 = netaddr_to_prefixstring(&buf,&((ninterf->rfc5444_if).interface)->multicast6->dst,0);
      uVar3 = rfc5444_strerror(rVar1);
      oonf_log(4,uVar4,"src/nhdp/nhdp/nhdp_writer.c",0xb6,0,0,
               "Could not send NHDP message to %s: %s (%d)",uVar2,uVar3,rVar1);
    }
  }
  return;
}

Assistant:

void
nhdp_writer_send_hello(struct nhdp_interface *ninterf) {
  enum rfc5444_result result;
  struct os_interface_listener *interf;
  struct netaddr_str buf;

  if (_cleanedup) {
    /* do not send more Hellos during shutdown */
    return;
  }

  interf = nhdp_interface_get_if_listener(ninterf);
  if (interf->data->flags.loopback) {
    /* no NHDP on loopback interface */
    return;
  }

  OONF_DEBUG(LOG_NHDP_W, "Sending Hello to interface %s", nhdp_interface_get_name(ninterf));

  nhdp_domain_recalculate_mpr();

  /* store NHDP interface */
  _nhdp_if = ninterf;

  /* send IPv4 (if socket is active) */
  result = oonf_rfc5444_send_if(ninterf->rfc5444_if.interface->multicast4, RFC6130_MSGTYPE_HELLO);
  if (result < 0) {
    OONF_WARN(LOG_NHDP_W, "Could not send NHDP message to %s: %s (%d)",
      netaddr_to_string(&buf, &ninterf->rfc5444_if.interface->multicast4->dst), rfc5444_strerror(result), result);
  }

  /* send IPV6 (if socket is active) */
  result = oonf_rfc5444_send_if(ninterf->rfc5444_if.interface->multicast6, RFC6130_MSGTYPE_HELLO);
  if (result < 0) {
    OONF_WARN(LOG_NHDP_W, "Could not send NHDP message to %s: %s (%d)",
      netaddr_to_string(&buf, &ninterf->rfc5444_if.interface->multicast6->dst), rfc5444_strerror(result), result);
  }
}